

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

wchar_t archive_entry_update_hardlink_utf8(archive_entry *entry,char *target)

{
  wchar_t wVar1;
  int *piVar2;
  char *target_local;
  archive_entry *entry_local;
  
  if (target == (char *)0x0) {
    entry->ae_set = entry->ae_set & 0xfffffffe;
  }
  else {
    entry->ae_set = entry->ae_set | 1;
  }
  wVar1 = archive_mstring_update_utf8(entry->archive,&entry->ae_hardlink,target);
  if (wVar1 == L'\0') {
    entry_local._4_4_ = L'\x01';
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      __archive_errx(1,"No memory");
    }
    entry_local._4_4_ = L'\0';
  }
  return entry_local._4_4_;
}

Assistant:

int
archive_entry_update_hardlink_utf8(struct archive_entry *entry, const char *target)
{
	if (target != NULL)
		entry->ae_set |= AE_SET_HARDLINK;
	else
		entry->ae_set &= ~AE_SET_HARDLINK;
	if (archive_mstring_update_utf8(entry->archive,
	    &entry->ae_hardlink, target) == 0)
		return (1);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (0);
}